

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::MacVerifyInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  Session *this_00;
  Token *pTVar5;
  long *plVar6;
  ulong uVar7;
  CK_STATE sessionState;
  long lVar8;
  CryptoFactory *pCVar9;
  undefined4 extraout_var;
  Session *inBitLen;
  size_t sVar10;
  undefined4 extraout_var_00;
  OSObject *in_RDX;
  Token *in_RSI;
  SymmetricKey *in_RDI;
  SymmetricKey *pubkey;
  MacAlgorithm *mac;
  size_t minSize;
  size_t bb;
  Type algo;
  CK_KEY_TYPE keyType;
  CK_RV rv;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  OSObject *key;
  Token *token;
  Session *session;
  Session *in_stack_ffffffffffffff48;
  Session *this_01;
  SymmetricKey *this_02;
  CK_OBJECT_HANDLE in_stack_ffffffffffffff90;
  long lVar11;
  HandleManager *in_stack_ffffffffffffff98;
  long lVar12;
  uint local_5c;
  SoftHSM *in_stack_fffffffffffffff8;
  CK_RV CVar13;
  
  if (((ulong)(in_RDI->keyData)._vptr_ByteString & 1) == 0) {
    CVar13 = 400;
  }
  else if (in_RDX == (OSObject *)0x0) {
    CVar13 = 7;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (this_00 == (Session *)0x0) {
      CVar13 = 0xb3;
    }
    else {
      iVar4 = Session::getOpType(this_00);
      if (iVar4 == 0) {
        pTVar5 = Session::getToken(this_00);
        if (pTVar5 == (Token *)0x0) {
          CVar13 = 5;
        }
        else {
          plVar6 = (long *)HandleManager::getObject
                                     (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          if ((plVar6 == (long *)0x0) || (uVar7 = (**(code **)(*plVar6 + 0x50))(), (uVar7 & 1) == 0)
             ) {
            CVar13 = 0x82;
          }
          else {
            bVar1 = (**(code **)(*plVar6 + 0x20))(plVar6,1,0);
            bVar2 = (**(code **)(*plVar6 + 0x20))(plVar6,2,1);
            sessionState = Session::getState(in_stack_ffffffffffffff48);
            CVar13 = haveRead(sessionState,bVar1 & 1,bVar2 & 1);
            if (CVar13 == 0) {
              uVar7 = (**(code **)(*plVar6 + 0x20))(plVar6,0x10a,0);
              if ((uVar7 & 1) == 0) {
                CVar13 = 0x68;
              }
              else {
                bVar3 = isMechanismPermitted(this,(OSObject *)hSession,pMechanism);
                if (bVar3) {
                  lVar8 = (**(code **)(*plVar6 + 0x28))(plVar6,0x100,0x80000000);
                  lVar12 = 8;
                  lVar11 = 0;
                  this_02 = (SymmetricKey *)in_RDX->_vptr_OSObject;
                  if (this_02 == (SymmetricKey *)0x138) {
                    if ((lVar8 != 0x14) && (lVar8 != 0x15)) {
                      return 99;
                    }
                    local_5c = 8;
                    lVar12 = 7;
                  }
                  else if (this_02 == (SymmetricKey *)0x211) {
                    if ((lVar8 != 0x10) && (lVar8 != 0x27)) {
                      return 99;
                    }
                    lVar11 = 0x10;
                    local_5c = 1;
                  }
                  else if (this_02 == (SymmetricKey *)0x221) {
                    if ((lVar8 != 0x10) && (lVar8 != 0x28)) {
                      return 99;
                    }
                    lVar11 = 0x14;
                    local_5c = 2;
                  }
                  else if (this_02 == (SymmetricKey *)0x251) {
                    if ((lVar8 != 0x10) && (lVar8 != 0x2b)) {
                      return 99;
                    }
                    lVar11 = 0x20;
                    local_5c = 4;
                  }
                  else if (this_02 == (SymmetricKey *)0x256) {
                    if ((lVar8 != 0x10) && (lVar8 != 0x2e)) {
                      return 99;
                    }
                    lVar11 = 0x1c;
                    local_5c = 3;
                  }
                  else if (this_02 == (SymmetricKey *)0x261) {
                    if ((lVar8 != 0x10) && (lVar8 != 0x2c)) {
                      return 99;
                    }
                    lVar11 = 0x30;
                    local_5c = 5;
                  }
                  else if (this_02 == (SymmetricKey *)0x271) {
                    if ((lVar8 != 0x10) && (lVar8 != 0x2d)) {
                      return 99;
                    }
                    lVar11 = 0x40;
                    local_5c = 6;
                  }
                  else {
                    if (this_02 != (SymmetricKey *)0x108a) {
                      return 0x70;
                    }
                    if (lVar8 != 0x1f) {
                      return 99;
                    }
                    local_5c = 9;
                  }
                  pCVar9 = CryptoFactory::i();
                  iVar4 = (*pCVar9->_vptr_CryptoFactory[6])(pCVar9,(ulong)local_5c);
                  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
                  if (plVar6 == (long *)0x0) {
                    CVar13 = 0x70;
                  }
                  else {
                    inBitLen = (Session *)operator_new(0x38);
                    SymmetricKey::SymmetricKey(this_02,(size_t)inBitLen);
                    CVar13 = getSymmetricKey(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
                    if (CVar13 == 0) {
                      this_01 = inBitLen;
                      (*inBitLen->_vptr_Session[4])();
                      sVar10 = ByteString::size((ByteString *)0x1717b1);
                      (*this_01->_vptr_Session[6])(this_01,sVar10 * lVar12);
                      iVar4 = (*inBitLen->_vptr_Session[7])();
                      if (CONCAT44(extraout_var_00,iVar4) < (ulong)(lVar11 << 3)) {
                        (**(code **)(*plVar6 + 0x50))(plVar6,inBitLen);
                        pCVar9 = CryptoFactory::i();
                        (*pCVar9->_vptr_CryptoFactory[7])(pCVar9,plVar6);
                        CVar13 = 0x62;
                      }
                      else {
                        uVar7 = (**(code **)(*plVar6 + 0x28))(plVar6,inBitLen);
                        if ((uVar7 & 1) == 0) {
                          (**(code **)(*plVar6 + 0x50))(plVar6,inBitLen);
                          pCVar9 = CryptoFactory::i();
                          (*pCVar9->_vptr_CryptoFactory[7])(pCVar9,plVar6);
                          CVar13 = 0x70;
                        }
                        else {
                          Session::setOpType(this_00,6);
                          Session::setMacOp(this_01,(MacAlgorithm *)in_stack_ffffffffffffff48);
                          Session::setAllowMultiPartOp(this_00,true);
                          Session::setAllowSinglePartOp(this_00,true);
                          Session::setSymmetricKey
                                    (this_01,(SymmetricKey *)in_stack_ffffffffffffff48);
                          CVar13 = 0;
                        }
                      }
                    }
                    else {
                      (**(code **)(*plVar6 + 0x50))(plVar6,inBitLen);
                      pCVar9 = CryptoFactory::i();
                      (*pCVar9->_vptr_CryptoFactory[7])(pCVar9,plVar6);
                      CVar13 = 5;
                    }
                  }
                }
                else {
                  CVar13 = 0x70;
                }
              }
            }
            else if (CVar13 == 0x101) {
              softHSMLog(6,"MacVerifyInit",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                         ,0x134b,"User is not authorized");
            }
          }
        }
      }
      else {
        CVar13 = 0x90;
      }
    }
  }
  return CVar13;
}

Assistant:

CK_RV SoftHSM::MacVerifyInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for verifying
	if (!key->getBooleanValue(CKA_VERIFY, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get key info
	CK_KEY_TYPE keyType = key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED);

	// Get the MAC algorithm matching the mechanism
	// Also check mechanism constraints
	MacAlgo::Type algo = MacAlgo::Unknown;
	size_t bb = 8;
	size_t minSize = 0;
	switch(pMechanism->mechanism) {
#ifndef WITH_FIPS
		case CKM_MD5_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_MD5_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 16;
			algo = MacAlgo::HMAC_MD5;
			break;
#endif
		case CKM_SHA_1_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA_1_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 20;
			algo = MacAlgo::HMAC_SHA1;
			break;
		case CKM_SHA224_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA224_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 28;
			algo = MacAlgo::HMAC_SHA224;
			break;
		case CKM_SHA256_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA256_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 32;
			algo = MacAlgo::HMAC_SHA256;
			break;
		case CKM_SHA384_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA384_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 48;
			algo = MacAlgo::HMAC_SHA384;
			break;
		case CKM_SHA512_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_SHA512_HMAC)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 64;
			algo = MacAlgo::HMAC_SHA512;
			break;
#ifdef WITH_GOST
		case CKM_GOSTR3411_HMAC:
			if (keyType != CKK_GENERIC_SECRET && keyType != CKK_GOST28147)
				return CKR_KEY_TYPE_INCONSISTENT;
			minSize = 32;
			algo = MacAlgo::HMAC_GOST;
			break;
#endif
		case CKM_DES3_CMAC:
			if (keyType != CKK_DES2 && keyType != CKK_DES3)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = MacAlgo::CMAC_DES;
			bb = 7;
			break;
		case CKM_AES_CMAC:
			if (keyType != CKK_AES)
				return CKR_KEY_TYPE_INCONSISTENT;
			algo = MacAlgo::CMAC_AES;
			break;
		default:
			return CKR_MECHANISM_INVALID;
	}
	MacAlgorithm* mac = CryptoFactory::i()->getMacAlgorithm(algo);
	if (mac == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* pubkey = new SymmetricKey();

	if (getSymmetricKey(pubkey, token, key) != CKR_OK)
	{
		mac->recycleKey(pubkey);
		CryptoFactory::i()->recycleMacAlgorithm(mac);
		return CKR_GENERAL_ERROR;
	}

	// Adjust key bit length
	pubkey->setBitLen(pubkey->getKeyBits().size() * bb);

	// Check key size
	if (pubkey->getBitLen() < (minSize*8))
	{
		mac->recycleKey(pubkey);
		CryptoFactory::i()->recycleMacAlgorithm(mac);
		return CKR_KEY_SIZE_RANGE;
	}

	// Initialize verifying
	if (!mac->verifyInit(pubkey))
	{
		mac->recycleKey(pubkey);
		CryptoFactory::i()->recycleMacAlgorithm(mac);
		return CKR_MECHANISM_INVALID;
	}

	session->setOpType(SESSION_OP_VERIFY);
	session->setMacOp(mac);
	session->setAllowMultiPartOp(true);
	session->setAllowSinglePartOp(true);
	session->setSymmetricKey(pubkey);

	return CKR_OK;
}